

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O0

void __thiscall
Fl_Graphics_Driver::xyline(Fl_Graphics_Driver *this,int x,int y,int x1,int y2,int x3)

{
  int iVar1;
  undefined2 local_38;
  undefined2 local_36;
  short local_34;
  undefined2 local_32;
  XPoint p [4];
  int x3_local;
  int y2_local;
  int x1_local;
  int y_local;
  int x_local;
  Fl_Graphics_Driver *this_local;
  
  p[3] = (XPoint)x3;
  iVar1 = clip_x(x);
  local_38 = (undefined2)iVar1;
  iVar1 = clip_x(y);
  local_36 = (undefined2)iVar1;
  local_32 = local_36;
  iVar1 = clip_x(x1);
  local_34 = (short)iVar1;
  p[0].x = local_34;
  iVar1 = clip_x(y2);
  p[0].y = (short)iVar1;
  p[1].y = p[0].y;
  iVar1 = clip_x((int)p[3]);
  p[1].x = (short)iVar1;
  XDrawLines(fl_display,fl_window,fl_gc,&local_38,4,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::xyline(int x, int y, int x1, int y2, int x3) {
#if defined(USE_X11)
  XPoint p[4];
  p[0].x = clip_x(x);  p[0].y = p[1].y = clip_x(y);
  p[1].x = p[2].x = clip_x(x1); p[2].y = p[3].y = clip_x(y2);
  p[3].x = clip_x(x3);
  XDrawLines(fl_display, fl_window, fl_gc, p, 4, 0);
#elif defined(WIN32)
  if(x3 < x1) x3--;
  else x3++;
  MoveToEx(fl_gc, x, y, 0L); 
  LineTo(fl_gc, x1, y);
  LineTo(fl_gc, x1, y2);
  LineTo(fl_gc, x3, y2);
#elif defined(__APPLE_QUARTZ__)
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x1, y);
  CGContextAddLineToPoint(fl_gc, x1, y2);
  CGContextAddLineToPoint(fl_gc, x3, y2);
  CGContextStrokePath(fl_gc);
  if (Fl_Display_Device::high_resolution()) {
    CGContextFillRect(fl_gc, CGRectMake(x-0.5, y  - fl_quartz_line_width_/2, 1 , fl_quartz_line_width_));
    CGContextFillRect(fl_gc, CGRectMake(x3-0.5, y2  - fl_quartz_line_width_/2, 1 , fl_quartz_line_width_));
  }
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}